

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles31::Functional::TextureSpecCase::iterate(TextureSpecCase *this)

{
  int iVar1;
  uint uVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  deBool dVar7;
  RenderContext *context;
  undefined4 extraout_var;
  TestLog *log_00;
  NotSupportedError *pNVar8;
  char *str;
  PixelFormat *pPVar9;
  TestError *this_01;
  Context *local_6558;
  Context *local_6548;
  int local_64e8;
  int local_64e4;
  int ndx_1;
  int ndx;
  MultisamplePixelBufferAccess local_64b8;
  MultisamplePixelBufferAccess local_6490;
  ReferenceContextLimits local_6468;
  undefined1 local_6410 [8];
  ReferenceContext refContext;
  undefined1 local_250 [8];
  ReferenceContextBuffers refBuffers;
  undefined1 local_1c8 [8];
  GLContext gles31Context;
  int y;
  int x;
  int height;
  int width;
  Random rnd;
  TestLog *log;
  RenderTarget *renderTarget;
  RenderContext *renderCtx;
  TextureSpecCase *this_local;
  RenderTarget *this_00;
  
  context = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*context->_vptr_RenderContext[4])();
  this_00 = (RenderTarget *)CONCAT44(extraout_var,iVar1);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  iVar1 = tcu::RenderTarget::getWidth(this_00);
  if (0xff < iVar1) {
    iVar1 = tcu::RenderTarget::getHeight(this_00);
    if (0xff < iVar1) {
      uVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
      if ((uVar2 & 1) == 0) {
        pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (pNVar8,"Extension not supported","",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureSpecificationTests.cpp"
                   ,0x90);
        __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      str = tcu::TestNode::getName((TestNode *)this);
      dVar3 = deStringHash(str);
      de::Random::Random((Random *)&height,dVar3);
      iVar1 = tcu::RenderTarget::getWidth(this_00);
      iVar1 = ::deMin32(iVar1,0x100);
      iVar4 = tcu::RenderTarget::getHeight(this_00);
      iVar4 = ::deMin32(iVar4,0x100);
      iVar5 = tcu::RenderTarget::getWidth(this_00);
      iVar5 = de::Random::getInt((Random *)&height,0,iVar5 - iVar1);
      iVar6 = tcu::RenderTarget::getHeight(this_00);
      gles31Context.m_programs.
      super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           de::Random::getInt((Random *)&height,0,iVar6 - iVar4);
      tcu::Vector<int,_4>::Vector
                ((Vector<int,_4> *)&refBuffers.m_stencilbuffer.m_data.m_cap,iVar5,
                 gles31Context.m_programs.
                 super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,iVar1,iVar4);
      sglr::GLContext::GLContext
                ((GLContext *)local_1c8,context,log_00,1,
                 (IVec4 *)&refBuffers.m_stencilbuffer.m_data.m_cap);
      pPVar9 = tcu::RenderTarget::getPixelFormat(this_00);
      tcu::PixelFormat::PixelFormat
                ((PixelFormat *)
                 &refContext.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,8,8,8,
                 (uint)(pPVar9->alphaBits != 0) << 3);
      sglr::ReferenceContextBuffers::ReferenceContextBuffers
                ((ReferenceContextBuffers *)local_250,
                 (PixelFormat *)
                 &refContext.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,0,0,iVar1,iVar4,1);
      sglr::ReferenceContextLimits::ReferenceContextLimits(&local_6468,context);
      sglr::ReferenceContextBuffers::getColorbuffer
                (&local_6490,(ReferenceContextBuffers *)local_250);
      sglr::ReferenceContextBuffers::getDepthbuffer
                (&local_64b8,(ReferenceContextBuffers *)local_250);
      sglr::ReferenceContextBuffers::getStencilbuffer
                ((MultisamplePixelBufferAccess *)&ndx_1,(ReferenceContextBuffers *)local_250);
      sglr::ReferenceContext::ReferenceContext
                ((ReferenceContext *)local_6410,&local_6468,&local_6490,&local_64b8,
                 (MultisamplePixelBufferAccess *)&ndx_1);
      sglr::ReferenceContextLimits::~ReferenceContextLimits(&local_6468);
      for (local_64e4 = 0; local_64e4 < 2; local_64e4 = local_64e4 + 1) {
        if (local_64e4 == 0) {
          local_6548 = (Context *)local_1c8;
        }
        else {
          local_6548 = (Context *)local_6410;
        }
        sglr::ContextWrapper::setContext(&this->super_ContextWrapper,local_6548);
        sglr::ContextWrapper::glClearColor(&this->super_ContextWrapper,0.125,0.25,0.5,1.0);
        sglr::ContextWrapper::glClear(&this->super_ContextWrapper,0x4500);
      }
      local_64e8 = 0;
      do {
        if (1 < local_64e8) {
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
          sglr::GLContext::enableLogging((GLContext *)local_1c8,0);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
                    (this,local_1c8,local_6410);
          sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)local_6410);
          sglr::ReferenceContextBuffers::~ReferenceContextBuffers
                    ((ReferenceContextBuffers *)local_250);
          sglr::GLContext::~GLContext((GLContext *)local_1c8);
          de::Random::~Random((Random *)&height);
          return STOP;
        }
        if (local_64e8 == 0) {
          local_6558 = (Context *)local_1c8;
        }
        else {
          local_6558 = (Context *)local_6410;
        }
        sglr::ContextWrapper::setContext(&this->super_ContextWrapper,local_6558);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])();
        do {
          dVar7 = ::deGetFalse();
          if (dVar7 != 0) {
LAB_02190fd7:
            this_01 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_01,(char *)0x0,"glGetError() == GL_NO_ERROR",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureSpecificationTests.cpp"
                       ,0xab);
            __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          dVar3 = sglr::ContextWrapper::glGetError(&this->super_ContextWrapper);
          if (dVar3 != 0) goto LAB_02190fd7;
          dVar7 = ::deGetFalse();
        } while (dVar7 != 0);
        local_64e8 = local_64e8 + 1;
      } while( true );
    }
  }
  pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (pNVar8,"Too small viewport","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureSpecificationTests.cpp"
             ,0x8d);
  __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

TextureSpecCase::IterateResult TextureSpecCase::iterate (void)
{
	glu::RenderContext&			renderCtx				= TestCase::m_context.getRenderContext();
	const tcu::RenderTarget&	renderTarget			= renderCtx.getRenderTarget();
	tcu::TestLog&				log						= m_testCtx.getLog();

	if (renderTarget.getWidth() < VIEWPORT_WIDTH || renderTarget.getHeight() < VIEWPORT_HEIGHT)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	if (!checkExtensionSupport())
		throw tcu::NotSupportedError("Extension not supported", "", __FILE__, __LINE__);

	// Context size, and viewport for GLES3.1
	de::Random	rnd			(deStringHash(getName()));
	int			width		= deMin32(renderTarget.getWidth(),	VIEWPORT_WIDTH);
	int			height		= deMin32(renderTarget.getHeight(),	VIEWPORT_HEIGHT);
	int			x			= rnd.getInt(0, renderTarget.getWidth()		- width);
	int			y			= rnd.getInt(0, renderTarget.getHeight()	- height);

	// Contexts.
	sglr::GLContext					gles31Context	(renderCtx, log, sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(x, y, width, height));
	sglr::ReferenceContextBuffers	refBuffers		(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), 0 /* depth */, 0 /* stencil */, width, height);
	sglr::ReferenceContext			refContext		(sglr::ReferenceContextLimits(renderCtx), refBuffers.getColorbuffer(), refBuffers.getDepthbuffer(), refBuffers.getStencilbuffer());

	// Clear color buffer.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		setContext(ndx ? (sglr::Context*)&refContext : (sglr::Context*)&gles31Context);
		glClearColor(0.125f, 0.25f, 0.5f, 1.0f);
		glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	}

	// Construct texture using both GLES3.1 and reference contexts.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		setContext(ndx ? (sglr::Context*)&refContext : (sglr::Context*)&gles31Context);
		createTexture();
		TCU_CHECK(glGetError() == GL_NO_ERROR);
	}

	// Initialize case result to pass.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Disable logging.
	gles31Context.enableLogging(0);

	// Verify results.
	verifyTexture(gles31Context, refContext);

	return STOP;
}